

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::
     RenderLineSegments<ImPlot::GetterYs<double>,ImPlot::GetterYRef,ImPlot::TransformerLogLog>
               (GetterYs<double> *getter1,GetterYRef *getter2,TransformerLogLog *transformer,
               ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ImVec2 IVar6;
  int iVar7;
  ImPlotPlot *pIVar8;
  double dVar9;
  ImPlotContext *pIVar10;
  ImPlotContext *pIVar11;
  ImPlotContext *pIVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  GetterYRef *local_50;
  TransformerLogLog *local_48;
  int local_40;
  ImU32 local_3c;
  float local_38;
  
  pIVar10 = GImPlot;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_40 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_40 = getter1->Count;
    }
    local_58 = (undefined1  [8])getter1;
    local_50 = getter2;
    local_48 = transformer;
    local_3c = col;
    local_38 = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterYs<double>,ImPlot::GetterYRef,ImPlot::TransformerLogLog>>
              ((LineSegmentsRenderer<ImPlot::GetterYs<double>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
                *)local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    iVar13 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      iVar13 = getter1->Count;
    }
    if (0 < iVar13) {
      iVar14 = 0;
      dVar17 = 0.0;
      do {
        pIVar11 = GImPlot;
        iVar7 = getter1->Count;
        dVar2 = *(double *)
                 ((long)getter1->Ys +
                 (long)(((getter1->Offset + iVar14) % iVar7 + iVar7) % iVar7) *
                 (long)getter1->Stride);
        dVar9 = log10((getter1->XScale * dVar17 + getter1->X0) /
                      (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar8 = pIVar11->CurrentPlot;
        dVar3 = pIVar11->LogDenX;
        dVar4 = (pIVar8->XAxis).Range.Min;
        dVar5 = (pIVar8->XAxis).Range.Max;
        dVar2 = log10(dVar2 / pIVar8->YAxis[transformer->YAxis].Range.Min);
        pIVar12 = GImPlot;
        iVar7 = transformer->YAxis;
        pIVar8 = pIVar11->CurrentPlot;
        auVar18._8_8_ = dVar2;
        auVar18._0_8_ = dVar9;
        auVar21._8_8_ = pIVar11->LogDenY[iVar7];
        auVar21._0_8_ = dVar3;
        auVar18 = divpd(auVar18,auVar21);
        dVar2 = pIVar8->YAxis[iVar7].Range.Min;
        IVar6 = pIVar11->PixelRange[iVar7].Min;
        local_58._4_4_ =
             (float)(pIVar11->My[iVar7] *
                     (((double)(float)auVar18._8_8_ * (pIVar8->YAxis[iVar7].Range.Max - dVar2) +
                      dVar2) - dVar2) + (double)IVar6.y);
        local_58._0_4_ =
             (float)(pIVar11->Mx *
                     (((double)(float)auVar18._0_8_ * (dVar5 - dVar4) + dVar4) -
                     (pIVar8->XAxis).Range.Min) + (double)IVar6.x);
        dVar2 = getter2->YRef;
        dVar9 = log10((getter2->XScale * dVar17 + getter2->X0) /
                      (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar8 = pIVar12->CurrentPlot;
        dVar3 = pIVar12->LogDenX;
        dVar4 = (pIVar8->XAxis).Range.Min;
        dVar5 = (pIVar8->XAxis).Range.Max;
        dVar2 = log10(dVar2 / pIVar8->YAxis[transformer->YAxis].Range.Min);
        iVar7 = transformer->YAxis;
        pIVar8 = pIVar12->CurrentPlot;
        auVar19._8_8_ = dVar2;
        auVar19._0_8_ = dVar9;
        auVar22._8_8_ = pIVar12->LogDenY[iVar7];
        auVar22._0_8_ = dVar3;
        auVar18 = divpd(auVar19,auVar22);
        dVar2 = pIVar8->YAxis[iVar7].Range.Min;
        IVar6 = pIVar12->PixelRange[iVar7].Min;
        fVar15 = (float)(pIVar12->Mx *
                         (((double)(float)auVar18._0_8_ * (dVar5 - dVar4) + dVar4) -
                         (pIVar8->XAxis).Range.Min) + (double)IVar6.x);
        fVar16 = (float)(pIVar12->My[iVar7] *
                         (((double)(float)auVar18._8_8_ * (pIVar8->YAxis[iVar7].Range.Max - dVar2) +
                          dVar2) - dVar2) + (double)IVar6.y);
        local_60.y = fVar16;
        local_60.x = fVar15;
        pIVar8 = pIVar10->CurrentPlot;
        fVar20 = (float)local_58._4_4_;
        if (fVar16 <= (float)local_58._4_4_) {
          fVar20 = fVar16;
        }
        if ((fVar20 < (pIVar8->PlotRect).Max.y) &&
           (fVar20 = (float)(~-(uint)(fVar16 <= (float)local_58._4_4_) & (uint)fVar16 |
                            local_58._4_4_ & -(uint)(fVar16 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar8->PlotRect).Min.y, *pfVar1 <= fVar20 && fVar20 != *pfVar1)) {
          fVar20 = (float)local_58._0_4_;
          if (fVar15 <= (float)local_58._0_4_) {
            fVar20 = fVar15;
          }
          if ((fVar20 < (pIVar8->PlotRect).Max.x) &&
             (fVar20 = (float)(-(uint)(fVar15 <= (float)local_58._0_4_) & local_58._0_4_ |
                              ~-(uint)(fVar15 <= (float)local_58._0_4_) & (uint)fVar15),
             (pIVar8->PlotRect).Min.x <= fVar20 && fVar20 != (pIVar8->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        dVar17 = dVar17 + 1.0;
        iVar14 = iVar14 + 1;
      } while (iVar13 != iVar14);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}